

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O0

void __thiscall MyClientConnection::OnTick(MyClientConnection *this,uint64_t nowUsec)

{
  int iVar1;
  FunctionTimer *in_RDI;
  uint8_t data_1 [2];
  uint8_t data [1];
  TonkStatus status;
  SDKConnection *in_stack_000002c0;
  uint64_t in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 local_29;
  uint local_28;
  
  tonk::SDKConnection::GetStatus((SDKConnection *)in_RDI);
  iVar1 = (int)in_RDI->Invokations + 1;
  *(int *)&in_RDI->Invokations = iVar1;
  if (99 < iVar1) {
    *(undefined4 *)&in_RDI->Invokations = 0;
    test::LogTonkStatus(in_stack_000002c0);
    if (((local_28 & 1) != 0) && ((*(byte *)(in_RDI->TotalUsec + 0x88) & 1) == 0)) {
      memset(&local_29,0,1);
      local_29 = 2;
      test::FunctionTimer::BeginCall(in_RDI);
      tonk::SDKConnection::Send
                ((SDKConnection *)
                 CONCAT17(in_stack_ffffffffffffffcf,
                          CONCAT16(in_stack_ffffffffffffffce,
                                   CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))),
                 in_RDI,in_stack_ffffffffffffffb8,0);
      test::FunctionTimer::EndCall(in_RDI);
    }
  }
  OnTick::counter = OnTick::counter + '\x01';
  tonk::SDKConnection::Send
            ((SDKConnection *)
             CONCAT17(OnTick::counter,
                      CONCAT16(200,CONCAT24(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))),
             in_RDI,in_stack_ffffffffffffffb8,0);
  return;
}

Assistant:

void MyClientConnection::OnTick(
    uint64_t          nowUsec   // Current timestamp in microseconds
)
{
    TonkStatus status = GetStatus();

    if (++StatusLogCounter >= 100)
    {
        StatusLogCounter = 0;
        LogTonkStatus(this);

        if (status.Flags & TonkFlag_TimeSync)
        {
            if (!Client->StartedP2PConnection)
            {
                // Tell server we want to connect to another peer
                uint8_t data[1] = {};
                data[0] = ID_P2PConnectionStart;
                t_tonk_send.BeginCall();
                Send(data, sizeof(data), TonkChannel_Reliable0);
                t_tonk_send.EndCall();
            }
        }
    }

    {
        static uint8_t counter = 0;
        uint8_t data[2] = { 200, ++counter };
        Send(data, sizeof(data), TonkChannel_Unordered);
    }

#ifdef TONK_ENABLE_1MBPS_DATA_CLIENT
    const unsigned fillTargetMsec = kLowPriQueueDepthMsec + (status.TimerIntervalUsec / 1000);
    if (status.LowPriQueueMsec < fillTargetMsec)
    {
        unsigned fillMsec = fillTargetMsec - status.LowPriQueueMsec;
        unsigned bytes = (unsigned)(((uint64_t)status.AppBPS * fillMsec) / 1000);
        unsigned packetsToSend = (bytes + kLowPriBulkData_Bytes - 1) / kLowPriBulkData_Bytes;
        for (unsigned i = 0; i < packetsToSend; ++i)
        {
            uint8_t data[kLowPriBulkData_Bytes] = {};
            for (unsigned i = 0; i < kLowPriBulkData_Bytes; ++i) {
                data[i] = (uint8_t)i;
            }

            const uint16_t ts16 = ToRemoteTime16(nowUsec);
            const uint32_t ts23 = ToRemoteTime23(nowUsec);

            data[0] = (status.Flags & TonkFlag_TimeSync) ? ID_LowPriBulkData_HasTimestamp : ID_LowPriBulkData_NoTimestamp;
            tonk::WriteU16_LE(data + 1, ts16);
            tonk::WriteU24_LE(data + 1 + 2, ts23);
            tonk::WriteU24_LE(data + 1 + 2 + 3, kLowPriBulkMagic);
            tonk::WriteU32_LE(data + 1 + 2 + 3 + 3, NextOutgoingWord++);

            t_tonk_send.BeginCall();
            Send(data, sizeof(data), kLowPriBulkData_Channel);
            t_tonk_send.EndCall();
        }
    }
#endif
}